

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<float>::Decompose_Cholesky
          (TPZMatrix<float> *this,list<long,_std::allocator<long>_> *singular)

{
  long lVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  int64_t k;
  long lVar4;
  long lVar5;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float __x;
  float extraout_XMM0_Da_03;
  float extraout_XMM0_Da_04;
  float extraout_XMM0_Da_05;
  float extraout_XMM0_Da_06;
  float extraout_XMM0_Da_07;
  float extraout_XMM0_Da_08;
  float extraout_XMM0_Da_09;
  long local_50;
  float local_48;
  float tmp;
  float local_40;
  float local_3c;
  list<long,_std::allocator<long>_> *local_38;
  
  cVar2 = (this->super_TPZBaseMatrix).fDecomposed;
  local_38 = singular;
  if ((cVar2 != '\0') && (cVar2 != '\x03')) {
    Error("Decompose_Cholesky <Matrix already Decomposed>",(char *)0x0);
    cVar2 = (this->super_TPZBaseMatrix).fDecomposed;
  }
  if (cVar2 == '\0') {
    if ((this->super_TPZBaseMatrix).fRow != (this->super_TPZBaseMatrix).fCol) {
      Error("Decompose_Cholesky <Matrix must be square>",(char *)0x0);
    }
    iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    for (local_50 = 0; local_50 < CONCAT44(extraout_var,iVar3); local_50 = local_50 + 1) {
      for (lVar4 = 0; lVar5 = local_50, lVar4 < local_50; lVar4 = lVar4 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (this,local_50,local_50);
        local_48 = extraout_XMM0_Da;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,local_50,lVar4);
        local_40 = extraout_XMM0_Da_00;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,local_50,lVar4);
        tmp = local_48 - extraout_XMM0_Da_01 * local_40;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar5,lVar5,&tmp);
      }
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,local_50,local_50)
      ;
      if (ABS(extraout_XMM0_Da_02) <= 1e-12) {
        std::__cxx11::list<long,_std::allocator<long>_>::push_back(local_38,&local_50);
        tmp = 1.0;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,local_50,local_50,&tmp);
      }
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,local_50);
      if (__x < 0.0) {
        tmp = sqrtf(__x);
      }
      else {
        tmp = SQRT(__x);
      }
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                (this,local_50,local_50,&tmp);
      lVar4 = local_50;
      while (lVar4 = lVar4 + 1, lVar4 < CONCAT44(extraout_var,iVar3)) {
        for (lVar5 = 0; lVar1 = local_50, lVar5 < local_50; lVar5 = lVar5 + 1) {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (this,local_50,lVar4);
          local_48 = extraout_XMM0_Da_03;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (this,local_50,lVar5);
          local_40 = extraout_XMM0_Da_04;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar5,lVar4);
          local_3c = local_48 - extraout_XMM0_Da_05 * local_40;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar1,lVar4,&local_3c);
        }
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (this,local_50,local_50);
        if (ABS(extraout_XMM0_Da_06) < 1e-06) {
          Error("Decompose_Cholesky <Zero on diagonal>",(char *)0x0);
        }
        lVar5 = local_50;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,local_50,lVar4);
        local_48 = extraout_XMM0_Da_07;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,local_50);
        local_3c = local_48 / extraout_XMM0_Da_08;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar5,lVar4,&local_3c);
        lVar5 = local_50;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,local_50,lVar4);
        local_3c = extraout_XMM0_Da_09;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar4,lVar5,&local_3c);
      }
    }
    (this->super_TPZBaseMatrix).fDecomposed = '\x03';
  }
  return 3;
}

Assistant:

int TPZMatrix<TVar>::Decompose_Cholesky(std::list<int64_t> &singular) {
	if (  fDecomposed && fDecomposed != ECholesky) Error( "Decompose_Cholesky <Matrix already Decomposed>" );
	if (  fDecomposed ) return ECholesky;
	if ( Rows()!=Cols() ) Error( "Decompose_Cholesky <Matrix must be square>" );
	//return 0;
	
	int64_t dim=Dim();
	for (int64_t i=0 ; i<dim; i++) {
		for(int64_t k=0; k<i; k++) {             //elementos da diagonal
			PutVal( i,i,GetVal(i,i)-GetVal(i,k)*GetVal(i,k) );
		}
		if((fabs(GetVal(i,i))) <= fabs((TVar)1.e-12))
		{
			singular.push_back(i);
			PutVal(i,i,1.);
		}
		TVar tmp = sqrt(GetVal(i,i));
        PutVal( i,i,tmp );
        for (int64_t j=i+1;j<dim; j++) {           //elementos fora da diagonal
            for(int64_t k=0; k<i; k++) {
                PutVal( i,j,GetVal(i,j)-GetVal(i,k)*GetVal(k,j) );
            }
            TVar tmp2 = GetVal(i,i);
            if ( IsZero(tmp2) ) {
				Error( "Decompose_Cholesky <Zero on diagonal>" );
            }
            PutVal(i,j,GetVal(i,j)/GetVal(i,i) );
            PutVal(j,i,GetVal(i,j));
			
        }
    }
	fDecomposed = ECholesky;
	return ECholesky;
}